

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

_Bool bitset_resize(bitset_t *bitset,size_t newarraysize,_Bool padwithzeroes)

{
  void *pvVar1;
  byte in_DL;
  void *in_RSI;
  long *in_RDI;
  size_t newcapacity;
  uint64_t *newarray;
  size_t smallest;
  size_t in_stack_ffffffffffffffb8;
  void *p;
  void *local_38;
  _Bool local_1;
  
  if (in_RSI < (void *)0x400000000000000) {
    p = in_RSI;
    if ((void *)in_RDI[1] <= in_RSI) {
      p = (void *)in_RDI[1];
    }
    if ((void *)in_RDI[2] < in_RSI) {
      local_38 = (void *)in_RDI[2];
      if (local_38 == (void *)0x0) {
        local_38 = (void *)0x1;
      }
      for (; local_38 < in_RSI; local_38 = (void *)((long)local_38 << 1)) {
      }
      pvVar1 = roaring_realloc(p,in_stack_ffffffffffffffb8);
      if (pvVar1 == (void *)0x0) {
        return false;
      }
      in_RDI[2] = (long)local_38;
      *in_RDI = (long)pvVar1;
    }
    if (((in_DL & 1) != 0) && (p < in_RSI)) {
      memset((void *)(*in_RDI + (long)p * 8),0,((long)in_RSI - (long)p) * 8);
    }
    in_RDI[1] = (long)in_RSI;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool bitset_resize(bitset_t *bitset, size_t newarraysize, bool padwithzeroes) {
    if (newarraysize > SIZE_MAX / 64) {
        return false;
    }
    size_t smallest =
        newarraysize < bitset->arraysize ? newarraysize : bitset->arraysize;
    if (bitset->capacity < newarraysize) {
        uint64_t *newarray;
        size_t newcapacity = bitset->capacity;
        if (newcapacity == 0) {
            newcapacity = 1;
        }
        while (newcapacity < newarraysize) {
            newcapacity *= 2;
        }
        if ((newarray = (uint64_t *)roaring_realloc(
                 bitset->array, sizeof(uint64_t) * newcapacity)) == NULL) {
            return false;
        }
        bitset->capacity = newcapacity;
        bitset->array = newarray;
    }
    if (padwithzeroes && (newarraysize > smallest))
        memset(bitset->array + smallest, 0,
               sizeof(uint64_t) * (newarraysize - smallest));
    bitset->arraysize = newarraysize;
    return true;  // success!
}